

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
mpt::typed_array<mpt::message_store::entry>::typed_array
          (typed_array<mpt::message_store::entry> *this,long len)

{
  content<mpt::message_store::entry> *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  default_data *pdVar3;
  
  (this->super_unique_array<mpt::message_store::entry>)._ref._ref =
       (content<mpt::message_store::entry> *)0x0;
  if (typed_array(long)::_dummy == '\0') {
    iVar2 = __cxa_guard_acquire(&typed_array(long)::_dummy);
    if (iVar2 != 0) {
      default_data::default_data(&typed_array::_dummy);
      __cxa_guard_release(&typed_array(long)::_dummy);
    }
  }
  if (len < 0) {
    pdVar3 = &typed_array::_dummy;
  }
  else {
    iVar2 = (*typed_array::_dummy.super_default_data.super_content<mpt::message_store::entry>.
              super_buffer._vptr_buffer[3])(&typed_array::_dummy,len << 3);
    pdVar3 = (default_data *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = (this->super_unique_array<mpt::message_store::entry>)._ref._ref;
  if (pcVar1 != (content<mpt::message_store::entry> *)0x0) {
    (*(pcVar1->super_buffer)._vptr_buffer[1])();
  }
  if ((content<mpt::message_store::entry> *)pdVar3 == (content<mpt::message_store::entry> *)0x0) {
    pdVar3 = &typed_array::_dummy;
  }
  (this->super_unique_array<mpt::message_store::entry>)._ref._ref =
       (content<mpt::message_store::entry> *)pdVar3;
  return;
}

Assistant:

typed_array(long len = -1) : unique_array<T>(static_cast<content<T> *>(0))
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		this->_ref.set_instance(data ? data : &_dummy);
	}